

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  BBox<embree::Vec3fa> *pBVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  undefined1 in_register_00001208 [56];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [64];
  float fVar52;
  float fVar53;
  undefined1 auVar51 [16];
  float fVar54;
  float fVar57;
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  
  auVar47._8_56_ = in_register_00001208;
  auVar47._0_8_ = time_range;
  auVar30 = vmovshdup_avx(auVar47._0_16_);
  fVar37 = auVar30._0_4_;
  fVar23 = time_range.lower;
  fVar2 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar24 = (set->super_PrimInfoMB).max_time_range.upper - fVar2;
  fVar36 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar43 = (((fVar23 * 0.5 + fVar37 * 0.5) - fVar2) / fVar24) * fVar36;
  auVar32._8_4_ = 0x80000000;
  auVar32._0_8_ = 0x8000000080000000;
  auVar32._12_4_ = 0x80000000;
  auVar32 = vandps_avx(ZEXT416((uint)fVar43),auVar32);
  auVar29._8_4_ = 0x3effffff;
  auVar29._0_8_ = 0x3effffff3effffff;
  auVar29._12_4_ = 0x3effffff;
  auVar32 = vorps_avx(auVar32,auVar29);
  auVar32 = ZEXT416((uint)(fVar43 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  fVar2 = (auVar32._0_4_ / fVar36) * fVar24 + fVar2;
  auVar32 = vcmpps_avx(auVar30,ZEXT416((uint)fVar2),6);
  auVar30 = vcmpps_avx(ZEXT416((uint)fVar2),auVar47._0_16_,6);
  auVar32 = vandps_avx(auVar30,auVar32);
  if (begin < end && (~auVar32[0] & 1) == 0) {
    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar32 = ZEXT816(0) << 0x40;
    do {
      if ((fVar23 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar2)) {
        auVar38._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar38._4_8_ = SUB128(ZEXT812(0),4);
        auVar38._12_4_ = 0;
        fVar43 = prims[begin].time_range.lower;
        fVar36 = prims[begin].time_range.upper - fVar43;
        fVar40 = (fVar23 - fVar43) / fVar36;
        fVar36 = (fVar2 - fVar43) / fVar36;
        fVar43 = fVar40 * auVar38._0_4_;
        fVar24 = auVar38._0_4_ * fVar36;
        auVar41 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
        auVar45 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
        auVar30 = vmaxss_avx(auVar41,auVar47._0_16_);
        auVar35 = ZEXT816(0) << 0x40;
        auVar29 = vminss_avx(auVar45,auVar38);
        fVar44 = auVar29._0_4_;
        iVar19 = (int)auVar41._0_4_;
        if (iVar19 < 0) {
          iVar19 = -1;
        }
        uVar9 = (int)auVar38._0_4_ + 1U;
        if ((int)auVar45._0_4_ < (int)((int)auVar38._0_4_ + 1U)) {
          uVar9 = (int)auVar45._0_4_;
        }
        lVar22 = (long)(int)auVar30._0_4_;
        pBVar4 = recalculatePrimRef->bounds->items;
        uVar17 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar1 = (float *)((long)&pBVar4[lVar22].lower.field_0 + uVar17);
        fVar48 = *pfVar1;
        fVar49 = pfVar1[1];
        fVar50 = pfVar1[2];
        fVar52 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar22].upper.field_0 + uVar17);
        fVar53 = *pfVar1;
        fVar54 = pfVar1[1];
        fVar57 = pfVar1[2];
        fVar58 = pfVar1[3];
        lVar21 = (long)(int)fVar44;
        pfVar1 = (float *)((long)&pBVar4[lVar21].lower.field_0 + uVar17);
        fVar59 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar21].upper.field_0 + uVar17);
        fVar13 = *pfVar1;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        auVar30 = ZEXT416((uint)(fVar43 - auVar30._0_4_));
        if (uVar9 - iVar19 == 1) {
          auVar30 = vmaxss_avx(auVar30,auVar35);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar41._0_4_ = fVar59 * auVar29._0_4_ + auVar30._0_4_ * fVar48;
          auVar41._4_4_ = fVar10 * auVar29._4_4_ + auVar30._4_4_ * fVar49;
          auVar41._8_4_ = fVar11 * auVar29._8_4_ + auVar30._8_4_ * fVar50;
          auVar41._12_4_ = fVar12 * auVar29._12_4_ + auVar30._12_4_ * fVar52;
          auVar45._0_4_ = auVar30._0_4_ * fVar53 + fVar13 * auVar29._0_4_;
          auVar45._4_4_ = auVar30._4_4_ * fVar54 + fVar14 * auVar29._4_4_;
          auVar45._8_4_ = auVar30._8_4_ * fVar57 + fVar15 * auVar29._8_4_;
          auVar45._12_4_ = auVar30._12_4_ * fVar58 + fVar16 * auVar29._12_4_;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar24)),auVar35);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar35._0_4_ = fVar48 * auVar29._0_4_ + auVar30._0_4_ * fVar59;
          auVar35._4_4_ = fVar49 * auVar29._4_4_ + auVar30._4_4_ * fVar10;
          auVar35._8_4_ = fVar50 * auVar29._8_4_ + auVar30._8_4_ * fVar11;
          auVar35._12_4_ = fVar52 * auVar29._12_4_ + auVar30._12_4_ * fVar12;
          auVar55._0_4_ = fVar53 * auVar29._0_4_ + fVar13 * auVar30._0_4_;
          auVar55._4_4_ = fVar54 * auVar29._4_4_ + fVar14 * auVar30._4_4_;
          auVar55._8_4_ = fVar57 * auVar29._8_4_ + fVar15 * auVar30._8_4_;
          auVar55._12_4_ = fVar58 * auVar29._12_4_ + fVar16 * auVar30._12_4_;
        }
        else {
          auVar30 = vmaxss_avx(auVar30,auVar35);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          pfVar1 = (float *)((long)&pBVar4[lVar22 + 1].lower.field_0 + uVar17);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar41._0_4_ = auVar29._0_4_ * *pfVar1 + auVar30._0_4_ * fVar48;
          auVar41._4_4_ = auVar29._4_4_ * pfVar1[1] + auVar30._4_4_ * fVar49;
          auVar41._8_4_ = auVar29._8_4_ * pfVar1[2] + auVar30._8_4_ * fVar50;
          auVar41._12_4_ = auVar29._12_4_ * pfVar1[3] + auVar30._12_4_ * fVar52;
          pfVar1 = (float *)((long)&pBVar4[lVar22 + 1].upper.field_0 + uVar17);
          auVar45._0_4_ = auVar30._0_4_ * fVar53 + auVar29._0_4_ * *pfVar1;
          auVar45._4_4_ = auVar30._4_4_ * fVar54 + auVar29._4_4_ * pfVar1[1];
          auVar45._8_4_ = auVar30._8_4_ * fVar57 + auVar29._8_4_ * pfVar1[2];
          auVar45._12_4_ = auVar30._12_4_ * fVar58 + auVar29._12_4_ * pfVar1[3];
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar24)),auVar35);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          pfVar1 = (float *)((long)&pBVar4[lVar21 + -1].lower.field_0 + uVar17);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar35._0_4_ = fVar59 * auVar30._0_4_ + auVar29._0_4_ * *pfVar1;
          auVar35._4_4_ = fVar10 * auVar30._4_4_ + auVar29._4_4_ * pfVar1[1];
          auVar35._8_4_ = fVar11 * auVar30._8_4_ + auVar29._8_4_ * pfVar1[2];
          auVar35._12_4_ = fVar12 * auVar30._12_4_ + auVar29._12_4_ * pfVar1[3];
          pfVar1 = (float *)((long)pBVar4 + lVar21 * 0x20 + (uVar17 - 0x10));
          auVar55._0_4_ = fVar13 * auVar30._0_4_ + auVar29._0_4_ * *pfVar1;
          auVar55._4_4_ = fVar14 * auVar30._4_4_ + auVar29._4_4_ * pfVar1[1];
          auVar55._8_4_ = fVar15 * auVar30._8_4_ + auVar29._8_4_ * pfVar1[2];
          auVar55._12_4_ = fVar16 * auVar30._12_4_ + auVar29._12_4_ * pfVar1[3];
          uVar20 = iVar19 + 1;
          if ((int)uVar20 < (int)uVar9) {
            pauVar18 = (undefined1 (*) [16])((long)&pBVar4[uVar20].upper.field_0 + uVar17);
            do {
              auVar25._0_4_ = ((float)(int)uVar20 / auVar38._0_4_ - fVar40) / (fVar36 - fVar40);
              auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar30 = vshufps_avx(auVar25,auVar25,0);
              fVar52 = auVar35._4_4_;
              fVar53 = auVar35._8_4_;
              fVar54 = auVar35._12_4_;
              auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - auVar25._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar25._0_4_)),0);
              fVar43 = auVar41._4_4_;
              fVar24 = auVar41._8_4_;
              fVar44 = auVar41._12_4_;
              auVar33._0_4_ = auVar35._0_4_ * auVar30._0_4_ + auVar41._0_4_ * auVar29._0_4_;
              auVar33._4_4_ = fVar52 * auVar30._4_4_ + fVar43 * auVar29._4_4_;
              auVar33._8_4_ = fVar53 * auVar30._8_4_ + fVar24 * auVar29._8_4_;
              auVar33._12_4_ = fVar54 * auVar30._12_4_ + fVar44 * auVar29._12_4_;
              fVar57 = auVar55._4_4_;
              fVar58 = auVar55._8_4_;
              fVar59 = auVar55._12_4_;
              fVar48 = auVar45._4_4_;
              fVar49 = auVar45._8_4_;
              fVar50 = auVar45._12_4_;
              auVar26._0_4_ = auVar55._0_4_ * auVar30._0_4_ + auVar45._0_4_ * auVar29._0_4_;
              auVar26._4_4_ = fVar57 * auVar30._4_4_ + fVar48 * auVar29._4_4_;
              auVar26._8_4_ = fVar58 * auVar30._8_4_ + fVar49 * auVar29._8_4_;
              auVar26._12_4_ = fVar59 * auVar30._12_4_ + fVar50 * auVar29._12_4_;
              auVar30 = vsubps_avx(pauVar18[-1],auVar33);
              auVar25 = vsubps_avx(*pauVar18,auVar26);
              auVar29 = vminps_avx(auVar30,auVar32);
              auVar30 = vmaxps_avx(auVar25,auVar32);
              auVar41._0_4_ = auVar41._0_4_ + auVar29._0_4_;
              auVar41._4_4_ = fVar43 + auVar29._4_4_;
              auVar41._8_4_ = fVar24 + auVar29._8_4_;
              auVar41._12_4_ = fVar44 + auVar29._12_4_;
              auVar35._0_4_ = auVar35._0_4_ + auVar29._0_4_;
              auVar35._4_4_ = fVar52 + auVar29._4_4_;
              auVar35._8_4_ = fVar53 + auVar29._8_4_;
              auVar35._12_4_ = fVar54 + auVar29._12_4_;
              auVar45._0_4_ = auVar45._0_4_ + auVar30._0_4_;
              auVar45._4_4_ = fVar48 + auVar30._4_4_;
              auVar45._8_4_ = fVar49 + auVar30._8_4_;
              auVar45._12_4_ = fVar50 + auVar30._12_4_;
              auVar55._0_4_ = auVar55._0_4_ + auVar30._0_4_;
              auVar55._4_4_ = fVar57 + auVar30._4_4_;
              auVar55._8_4_ = fVar58 + auVar30._8_4_;
              auVar55._12_4_ = fVar59 + auVar30._12_4_;
              uVar20 = uVar20 + 1;
              pauVar18 = pauVar18 + 2;
            } while (uVar9 != uVar20);
          }
        }
        aVar7.m128 = (__m128)vminps_avx(this->bounds0[0].bounds0.lower.field_0,auVar41);
        aVar5.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds0.upper.field_0,auVar45);
        aVar8.m128 = (__m128)vminps_avx(this->bounds0[0].bounds1.lower.field_0,auVar35);
        aVar6.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds1.upper.field_0,auVar55);
        this->bounds0[0].bounds0.lower.field_0 = aVar7;
        this->bounds0[0].bounds0.upper.field_0 = aVar5;
        this->bounds0[0].bounds1.lower.field_0 = aVar8;
        this->bounds0[0].bounds1.upper.field_0 = aVar6;
        fVar24 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        BVar3 = prims[begin].time_range;
        auVar30._8_8_ = 0;
        auVar30._0_4_ = BVar3.lower;
        auVar30._4_4_ = BVar3.upper;
        auVar30 = vmovshdup_avx(auVar30);
        fVar36 = BVar3.lower;
        fVar43 = auVar30._0_4_ - fVar36;
        auVar30 = ZEXT416((uint)(((fVar23 - fVar36) / fVar43) * 1.0000002 * fVar24));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,auVar30);
        auVar29 = ZEXT416((uint)(((fVar2 - fVar36) / fVar43) * 0.99999976 * fVar24));
        auVar29 = vroundss_avx(auVar29,auVar29,10);
        auVar29 = vminss_avx(auVar29,ZEXT416((uint)fVar24));
        this->count0[0] = this->count0[0] + (long)((int)auVar29._0_4_ - (int)auVar30._0_4_);
      }
      if ((fVar2 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar37)) {
        auVar39._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar39._4_8_ = SUB128(ZEXT812(0),4);
        auVar39._12_4_ = 0;
        fVar43 = prims[begin].time_range.lower;
        fVar36 = prims[begin].time_range.upper - fVar43;
        fVar40 = (fVar2 - fVar43) / fVar36;
        fVar36 = (fVar37 - fVar43) / fVar36;
        fVar43 = fVar40 * auVar39._0_4_;
        fVar24 = auVar39._0_4_ * fVar36;
        auVar41 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
        auVar45 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
        auVar30 = vmaxss_avx(auVar41,auVar47._0_16_);
        auVar29 = vminss_avx(auVar45,auVar39);
        fVar44 = auVar29._0_4_;
        iVar19 = (int)auVar41._0_4_;
        if (iVar19 < 0) {
          iVar19 = -1;
        }
        uVar9 = (int)auVar39._0_4_ + 1U;
        if ((int)auVar45._0_4_ < (int)((int)auVar39._0_4_ + 1U)) {
          uVar9 = (int)auVar45._0_4_;
        }
        lVar22 = (long)(int)auVar30._0_4_;
        pBVar4 = recalculatePrimRef->bounds->items;
        uVar17 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar1 = (float *)((long)&pBVar4[lVar22].lower.field_0 + uVar17);
        fVar48 = *pfVar1;
        fVar49 = pfVar1[1];
        fVar50 = pfVar1[2];
        fVar52 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar22].upper.field_0 + uVar17);
        fVar53 = *pfVar1;
        fVar54 = pfVar1[1];
        fVar57 = pfVar1[2];
        fVar58 = pfVar1[3];
        lVar21 = (long)(int)fVar44;
        pfVar1 = (float *)((long)&pBVar4[lVar21].lower.field_0 + uVar17);
        fVar59 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar21].upper.field_0 + uVar17);
        fVar13 = *pfVar1;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        auVar29 = ZEXT816(0) << 0x40;
        auVar30 = vmaxss_avx(ZEXT416((uint)(fVar43 - auVar30._0_4_)),auVar29);
        if (uVar9 - iVar19 == 1) {
          auVar41 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar42._0_4_ = fVar59 * auVar41._0_4_ + fVar48 * auVar30._0_4_;
          auVar42._4_4_ = fVar10 * auVar41._4_4_ + fVar49 * auVar30._4_4_;
          auVar42._8_4_ = fVar11 * auVar41._8_4_ + fVar50 * auVar30._8_4_;
          auVar42._12_4_ = fVar12 * auVar41._12_4_ + fVar52 * auVar30._12_4_;
          auVar46._0_4_ = fVar13 * auVar41._0_4_ + fVar53 * auVar30._0_4_;
          auVar46._4_4_ = fVar14 * auVar41._4_4_ + fVar54 * auVar30._4_4_;
          auVar46._8_4_ = fVar15 * auVar41._8_4_ + fVar57 * auVar30._8_4_;
          auVar46._12_4_ = fVar16 * auVar41._12_4_ + fVar58 * auVar30._12_4_;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar24)),auVar29);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar51._0_4_ = fVar48 * auVar29._0_4_ + fVar59 * auVar30._0_4_;
          auVar51._4_4_ = fVar49 * auVar29._4_4_ + fVar10 * auVar30._4_4_;
          auVar51._8_4_ = fVar50 * auVar29._8_4_ + fVar11 * auVar30._8_4_;
          auVar51._12_4_ = fVar52 * auVar29._12_4_ + fVar12 * auVar30._12_4_;
          auVar56._0_4_ = fVar53 * auVar29._0_4_ + fVar13 * auVar30._0_4_;
          auVar56._4_4_ = fVar54 * auVar29._4_4_ + fVar14 * auVar30._4_4_;
          auVar56._8_4_ = fVar57 * auVar29._8_4_ + fVar15 * auVar30._8_4_;
          auVar56._12_4_ = fVar58 * auVar29._12_4_ + fVar16 * auVar30._12_4_;
        }
        else {
          auVar41 = vshufps_avx(auVar30,auVar30,0);
          pfVar1 = (float *)((long)&pBVar4[lVar22 + 1].lower.field_0 + uVar17);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar42._0_4_ = auVar41._0_4_ * *pfVar1 + fVar48 * auVar30._0_4_;
          auVar42._4_4_ = auVar41._4_4_ * pfVar1[1] + fVar49 * auVar30._4_4_;
          auVar42._8_4_ = auVar41._8_4_ * pfVar1[2] + fVar50 * auVar30._8_4_;
          auVar42._12_4_ = auVar41._12_4_ * pfVar1[3] + fVar52 * auVar30._12_4_;
          pfVar1 = (float *)((long)&pBVar4[lVar22 + 1].upper.field_0 + uVar17);
          auVar46._0_4_ = fVar53 * auVar30._0_4_ + auVar41._0_4_ * *pfVar1;
          auVar46._4_4_ = fVar54 * auVar30._4_4_ + auVar41._4_4_ * pfVar1[1];
          auVar46._8_4_ = fVar57 * auVar30._8_4_ + auVar41._8_4_ * pfVar1[2];
          auVar46._12_4_ = fVar58 * auVar30._12_4_ + auVar41._12_4_ * pfVar1[3];
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar24)),auVar29);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          pfVar1 = (float *)((long)&pBVar4[lVar21 + -1].lower.field_0 + uVar17);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar51._0_4_ = fVar59 * auVar30._0_4_ + auVar29._0_4_ * *pfVar1;
          auVar51._4_4_ = fVar10 * auVar30._4_4_ + auVar29._4_4_ * pfVar1[1];
          auVar51._8_4_ = fVar11 * auVar30._8_4_ + auVar29._8_4_ * pfVar1[2];
          auVar51._12_4_ = fVar12 * auVar30._12_4_ + auVar29._12_4_ * pfVar1[3];
          pfVar1 = (float *)((long)pBVar4 + lVar21 * 0x20 + (uVar17 - 0x10));
          auVar56._0_4_ = fVar13 * auVar30._0_4_ + auVar29._0_4_ * *pfVar1;
          auVar56._4_4_ = fVar14 * auVar30._4_4_ + auVar29._4_4_ * pfVar1[1];
          auVar56._8_4_ = fVar15 * auVar30._8_4_ + auVar29._8_4_ * pfVar1[2];
          auVar56._12_4_ = fVar16 * auVar30._12_4_ + auVar29._12_4_ * pfVar1[3];
          uVar20 = iVar19 + 1;
          if ((int)uVar20 < (int)uVar9) {
            pauVar18 = (undefined1 (*) [16])((long)&pBVar4[uVar20].upper.field_0 + uVar17);
            do {
              auVar27._0_4_ = ((float)(int)uVar20 / auVar39._0_4_ - fVar40) / (fVar36 - fVar40);
              auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar30 = vshufps_avx(auVar27,auVar27,0);
              fVar52 = auVar51._4_4_;
              fVar53 = auVar51._8_4_;
              fVar54 = auVar51._12_4_;
              auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - auVar27._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar27._0_4_)),0);
              fVar43 = auVar42._4_4_;
              fVar24 = auVar42._8_4_;
              fVar44 = auVar42._12_4_;
              auVar34._0_4_ = auVar51._0_4_ * auVar30._0_4_ + auVar42._0_4_ * auVar29._0_4_;
              auVar34._4_4_ = fVar52 * auVar30._4_4_ + fVar43 * auVar29._4_4_;
              auVar34._8_4_ = fVar53 * auVar30._8_4_ + fVar24 * auVar29._8_4_;
              auVar34._12_4_ = fVar54 * auVar30._12_4_ + fVar44 * auVar29._12_4_;
              fVar57 = auVar56._4_4_;
              fVar58 = auVar56._8_4_;
              fVar59 = auVar56._12_4_;
              fVar48 = auVar46._4_4_;
              fVar49 = auVar46._8_4_;
              fVar50 = auVar46._12_4_;
              auVar28._0_4_ = auVar56._0_4_ * auVar30._0_4_ + auVar46._0_4_ * auVar29._0_4_;
              auVar28._4_4_ = fVar57 * auVar30._4_4_ + fVar48 * auVar29._4_4_;
              auVar28._8_4_ = fVar58 * auVar30._8_4_ + fVar49 * auVar29._8_4_;
              auVar28._12_4_ = fVar59 * auVar30._12_4_ + fVar50 * auVar29._12_4_;
              auVar30 = vsubps_avx(pauVar18[-1],auVar34);
              auVar41 = vsubps_avx(*pauVar18,auVar28);
              auVar29 = vminps_avx(auVar30,auVar32);
              auVar30 = vmaxps_avx(auVar41,auVar32);
              auVar42._0_4_ = auVar42._0_4_ + auVar29._0_4_;
              auVar42._4_4_ = fVar43 + auVar29._4_4_;
              auVar42._8_4_ = fVar24 + auVar29._8_4_;
              auVar42._12_4_ = fVar44 + auVar29._12_4_;
              auVar51._0_4_ = auVar51._0_4_ + auVar29._0_4_;
              auVar51._4_4_ = fVar52 + auVar29._4_4_;
              auVar51._8_4_ = fVar53 + auVar29._8_4_;
              auVar51._12_4_ = fVar54 + auVar29._12_4_;
              auVar46._0_4_ = auVar46._0_4_ + auVar30._0_4_;
              auVar46._4_4_ = fVar48 + auVar30._4_4_;
              auVar46._8_4_ = fVar49 + auVar30._8_4_;
              auVar46._12_4_ = fVar50 + auVar30._12_4_;
              auVar56._0_4_ = auVar56._0_4_ + auVar30._0_4_;
              auVar56._4_4_ = fVar57 + auVar30._4_4_;
              auVar56._8_4_ = fVar58 + auVar30._8_4_;
              auVar56._12_4_ = fVar59 + auVar30._12_4_;
              uVar20 = uVar20 + 1;
              pauVar18 = pauVar18 + 2;
            } while (uVar9 != uVar20);
          }
        }
        aVar7.m128 = (__m128)vminps_avx(this->bounds1[0].bounds0.lower.field_0,auVar42);
        aVar5.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds0.upper.field_0,auVar46);
        aVar8.m128 = (__m128)vminps_avx(this->bounds1[0].bounds1.lower.field_0,auVar51);
        aVar6.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds1.upper.field_0,auVar56);
        this->bounds1[0].bounds0.lower.field_0 = aVar7;
        this->bounds1[0].bounds0.upper.field_0 = aVar5;
        this->bounds1[0].bounds1.lower.field_0 = aVar8;
        this->bounds1[0].bounds1.upper.field_0 = aVar6;
        fVar24 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        BVar3 = prims[begin].time_range;
        auVar31._8_8_ = 0;
        auVar31._0_4_ = BVar3.lower;
        auVar31._4_4_ = BVar3.upper;
        fVar36 = BVar3.lower;
        auVar30 = vmovshdup_avx(auVar31);
        fVar43 = auVar30._0_4_ - fVar36;
        auVar30 = ZEXT416((uint)(((fVar2 - fVar36) / fVar43) * 1.0000002 * fVar24));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,auVar30);
        auVar29 = ZEXT416((uint)(((fVar37 - fVar36) / fVar43) * 0.99999976 * fVar24));
        auVar29 = vroundss_avx(auVar29,auVar29,10);
        auVar29 = vminss_avx(auVar29,ZEXT416((uint)fVar24));
        this->count1[0] = this->count1[0] + (long)((int)auVar29._0_4_ - (int)auVar30._0_4_);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }